

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<const_kj::WritableFileMapping,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskFile::mmapWritable(DiskFile *this,uint64_t offset,uint64_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  uint64_t in_RCX;
  WritableFileMapping *extraout_RDX;
  WritableFileMapping *extraout_RDX_00;
  WritableFileMapping *pWVar3;
  long lVar4;
  MmapRange MVar5;
  Own<const_kj::WritableFileMapping,_std::nullptr_t> OVar6;
  Fault f;
  Fault local_50;
  long local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  
  if (in_RCX == 0) {
    puVar2 = (undefined8 *)operator_new(0x20);
    *puVar2 = &PTR_get_00281718;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    pWVar3 = extraout_RDX_00;
  }
  else {
    MVar5 = getMmapRange(size,in_RCX);
    pvVar1 = mmap64((void *)0x0,MVar5.size,3,1,*(int *)(offset + 8),MVar5.offset);
    if (pvVar1 == (void *)0xffffffffffffffff) {
      __errno_location();
      local_50.exception = (Exception *)0x0;
      local_48 = 0;
      uStack_40 = 0;
      kj::_::Debug::Fault::init
                (&local_50,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_50);
    }
    lVar4 = (long)pvVar1 + (size - MVar5.offset);
    local_38 = &(anonymous_namespace)::mmapDisposer;
    local_48 = lVar4;
    puVar2 = (undefined8 *)operator_new(0x20);
    *puVar2 = &PTR_get_00281718;
    puVar2[1] = lVar4;
    puVar2[2] = in_RCX;
    puVar2[3] = &(anonymous_namespace)::mmapDisposer;
    pWVar3 = extraout_RDX;
  }
  (this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode =
       (_func_int **)
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::
        instance;
  *(undefined8 **)&this->super_DiskHandle = puVar2;
  OVar6.ptr = pWVar3;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

Own<const WritableFileMapping> mmapWritable(uint64_t offset, uint64_t size) const override {
    return DiskHandle::mmapWritable(offset, size);
  }